

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ns_core.c
# Opt level: O0

void FFT(NoiseSuppressionC *self,float *time_data,size_t time_data_length,size_t magnitude_length,
        float *real,float *imag,float *magn)

{
  float fVar1;
  ulong local_40;
  size_t i;
  float *imag_local;
  float *real_local;
  size_t magnitude_length_local;
  size_t time_data_length_local;
  float *time_data_local;
  NoiseSuppressionC *self_local;
  
  if (magnitude_length == (time_data_length >> 1) + 1) {
    WebRtc_rdft(time_data_length,1,time_data,self->ip,self->wfft);
    *imag = 0.0;
    *real = *time_data;
    *magn = ABS(*real) + 1.0;
    imag[magnitude_length - 1] = 0.0;
    real[magnitude_length - 1] = time_data[1];
    magn[magnitude_length - 1] = ABS(real[magnitude_length - 1]) + 1.0;
    for (local_40 = 1; local_40 < magnitude_length - 1; local_40 = local_40 + 1) {
      real[local_40] = time_data[local_40 * 2];
      imag[local_40] = time_data[local_40 * 2 + 1];
      fVar1 = sqrtf(real[local_40] * real[local_40] + imag[local_40] * imag[local_40]);
      magn[local_40] = fVar1 + 1.0;
    }
    return;
  }
  __assert_fail("magnitude_length == time_data_length / 2 + 1",
                "/workspace/llm4binary/github/license_c_cmakelists/ctwgL[P]webrtc-beamforming/webrtc/webrtc/modules/audio_processing/ns/ns_core.c"
                ,0x380,
                "void FFT(NoiseSuppressionC *, float *, size_t, size_t, float *, float *, float *)")
  ;
}

Assistant:

static void FFT(NoiseSuppressionC* self,
                float* time_data,
                size_t time_data_length,
                size_t magnitude_length,
                float* real,
                float* imag,
                float* magn) {
  size_t i;

  assert(magnitude_length == time_data_length / 2 + 1);

  WebRtc_rdft(time_data_length, 1, time_data, self->ip, self->wfft);

  imag[0] = 0;
  real[0] = time_data[0];
  magn[0] = fabsf(real[0]) + 1.f;
  imag[magnitude_length - 1] = 0;
  real[magnitude_length - 1] = time_data[1];
  magn[magnitude_length - 1] = fabsf(real[magnitude_length - 1]) + 1.f;
  for (i = 1; i < magnitude_length - 1; ++i) {
    real[i] = time_data[2 * i];
    imag[i] = time_data[2 * i + 1];
    // Magnitude spectrum.
    magn[i] = sqrtf(real[i] * real[i] + imag[i] * imag[i]) + 1.f;
  }
}